

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O0

void __thiscall
Maze::printMatrix(Maze *this,
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 *Matrix)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  ostream *poVar4;
  int local_20;
  int local_1c;
  int j;
  int i;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *Matrix_local;
  Maze *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            ::size(Matrix);
    if (sVar1 <= (ulong)(long)local_1c) break;
    local_20 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(Matrix,(long)local_1c);
      sVar1 = std::vector<char,_std::allocator<char>_>::size(pvVar2);
      if (sVar1 <= (ulong)(long)local_20) break;
      pvVar2 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(Matrix,(long)local_1c);
      pvVar3 = std::vector<char,_std::allocator<char>_>::at(pvVar2,(long)local_20);
      poVar4 = std::operator<<((ostream *)&std::cout,*pvVar3);
      std::operator<<(poVar4," ");
      local_20 = local_20 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Maze::printMatrix(std::vector<std::vector<char>> Matrix) {
    //prints the maze

    for(int i = 0; i < Matrix.size(); i++){
        for(int j = 0; j < Matrix.at(i).size(); j++){
            std::cout<< Matrix.at(i).at(j)<<" ";
        }
        std::cout<< std::endl;
    }

}